

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O3

void __thiscall
Memory::
PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
::TransferSegment(PageAllocatorBase<Memory::PreReservedVirtualAllocWrapper,_Memory::SegmentBase<Memory::PreReservedVirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>_>
                  *this,PageSegmentBase<Memory::PreReservedVirtualAllocWrapper> *segment,
                 DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                 *fromSegmentList)

{
  SecondaryAllocator *pSVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount> *list;
  undefined4 *puVar5;
  
  list = GetSegmentList(this,segment);
  if (list != fromSegmentList) {
    if (list != (DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>
                 *)0x0) {
      pSVar1 = (segment->super_SegmentBase<Memory::PreReservedVirtualAllocWrapper>).
               secondaryAllocator;
      if (&this->fullSegments == fromSegmentList && pSVar1 != (SecondaryAllocator *)0x0) {
        iVar4 = (*pSVar1->_vptr_SecondaryAllocator[3])();
        if ((char)iVar4 == '\0') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                             ,0x6d9,
                             "(segment->GetSecondaryAllocator() == nullptr || fromSegmentList != &fullSegments || segment->GetSecondaryAllocator()->CanAllocate())"
                             ,
                             "If it\'s being moved from a full segment it should be able to do secondary allocations"
                            );
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
      }
      DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
      MoveElementTo(fromSegmentList,segment,list);
      return;
    }
    LogFreePartiallyDecommittedPageSegment(this,segment);
    DListBase<Memory::PageSegmentBase<Memory::PreReservedVirtualAllocWrapper>,_RealCount>::
    RemoveElement<Memory::NoThrowHeapAllocator>
              (fromSegmentList,(NoThrowHeapAllocator *)&NoThrowHeapAllocator::Instance,segment);
    this->decommitPageCount = this->decommitPageCount - (ulong)this->maxAllocPageCount;
  }
  return;
}

Assistant:

void
PageAllocatorBase<TVirtualAlloc, TSegment, TPageSegment>::TransferSegment(TPageSegment * segment, DListBase<TPageSegment> * fromSegmentList)
{
    DListBase<TPageSegment> * toSegmentList = GetSegmentList(segment);

    if (fromSegmentList != toSegmentList)
    {
        if (toSegmentList)
        {
            AssertMsg(segment->GetSecondaryAllocator() == nullptr  || fromSegmentList != &fullSegments || segment->GetSecondaryAllocator()->CanAllocate(),
                "If it's being moved from a full segment it should be able to do secondary allocations");
            fromSegmentList->MoveElementTo(segment, toSegmentList);
        }
        else
        {
            LogFreePartiallyDecommittedPageSegment(segment);
            fromSegmentList->RemoveElement(&NoThrowNoMemProtectHeapAllocator::Instance, segment);
#if DBG_DUMP
            this->decommitPageCount -= maxAllocPageCount;
#endif
        }
    }
}